

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

UnaryBinsSelectExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnaryBinsSelectExprSyntax,slang::parsing::Token&,slang::syntax::BinsSelectConditionExprSyntax&>
          (BumpAllocator *this,Token *args,BinsSelectConditionExprSyntax *args_1)

{
  Token op;
  UnaryBinsSelectExprSyntax *this_00;
  
  this_00 = (UnaryBinsSelectExprSyntax *)allocate(this,0x28,8);
  op.kind = args->kind;
  op._2_1_ = args->field_0x2;
  op.numFlags.raw = (args->numFlags).raw;
  op.rawLen = args->rawLen;
  op.info = args->info;
  slang::syntax::UnaryBinsSelectExprSyntax::UnaryBinsSelectExprSyntax(this_00,op,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }